

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::ColorEditOptionsPopup(float *col,ImGuiColorEditFlags flags)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint flags_00;
  uint in_ESI;
  float *in_RDI;
  bool bVar5;
  bool bVar6;
  float fVar7;
  bool in_stack_00000027;
  char *in_stack_00000028;
  char buf [64];
  int ca;
  int cb;
  int cg;
  int cr;
  ImGuiColorEditFlags opts;
  ImGuiContext *g;
  bool allow_opt_datatype;
  bool allow_opt_inputs;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  ImGuiWindowFlags in_stack_ffffffffffffff14;
  char *in_stack_ffffffffffffff18;
  float local_c4;
  int local_9c;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  char local_78 [64];
  undefined4 in_stack_ffffffffffffffc8;
  int iVar8;
  undefined1 selected;
  float in_stack_ffffffffffffffdc;
  ImGuiContext *pIVar9;
  
  bVar5 = (in_ESI & 0x700000) == 0;
  bVar6 = (in_ESI & 0x1800000) == 0;
  if (((bVar5) || (bVar6)) &&
     (bVar1 = BeginPopup(in_stack_ffffffffffffff18,in_stack_ffffffffffffff14), bVar1)) {
    uVar2 = GImGui->ColorEditOptions;
    pIVar9 = GImGui;
    if (bVar5) {
      bVar1 = RadioButton(in_stack_00000028,in_stack_00000027);
      if (bVar1) {
        uVar2 = uVar2 & 0xff8fffff | 0x100000;
      }
      bVar1 = RadioButton(in_stack_00000028,in_stack_00000027);
      if (bVar1) {
        uVar2 = uVar2 & 0xff8fffff | 0x200000;
      }
      bVar1 = RadioButton(in_stack_00000028,in_stack_00000027);
      if (bVar1) {
        uVar2 = uVar2 & 0xff8fffff | 0x400000;
      }
    }
    if (bVar6) {
      if (bVar5) {
        Separator();
      }
      bVar1 = RadioButton(in_stack_00000028,in_stack_00000027);
      if (bVar1) {
        uVar2 = uVar2 & 0xfe7fffff | 0x800000;
      }
      bVar1 = RadioButton(in_stack_00000028,in_stack_00000027);
      if (bVar1) {
        uVar2 = uVar2 & 0xfe7fffff | 0x1000000;
      }
    }
    if ((bVar5) || (bVar6)) {
      Separator();
    }
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffdc,-1.0,0.0);
    bVar5 = Button((char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (ImVec2 *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    if (bVar5) {
      OpenPopup((char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    }
    bVar5 = BeginPopup(in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
    if (bVar5) {
      fVar7 = ImSaturate(*in_RDI);
      uVar3 = (uint)(fVar7 * 255.0 + 0.5);
      fVar7 = ImSaturate(in_RDI[1]);
      uVar4 = (uint)(fVar7 * 255.0 + 0.5);
      fVar7 = ImSaturate(in_RDI[2]);
      flags_00 = (uint)(fVar7 * 255.0 + 0.5);
      if ((in_ESI & 2) == 0) {
        fVar7 = ImSaturate(in_RDI[3]);
        local_9c = (int)(fVar7 * 255.0 + 0.5);
      }
      else {
        local_9c = 0xff;
      }
      if ((in_ESI & 2) == 0) {
        local_c4 = in_RDI[3];
      }
      else {
        local_c4 = 1.0;
      }
      ImFormatString((char *)(double)*in_RDI,(size_t)(double)in_RDI[1],(char *)(double)in_RDI[2],
                     (double)local_c4,local_78,0x40,"(%.3ff, %.3ff, %.3ff, %.3ff)");
      ImVec2::ImVec2(&local_80,0.0,0.0);
      bVar5 = Selectable((char *)CONCAT44(in_stack_ffffffffffffffdc,uVar3),SUB41(uVar4 >> 0x18,0),
                         flags_00,(ImVec2 *)CONCAT44(local_9c,in_stack_ffffffffffffffc8));
      if (bVar5) {
        SetClipboardText((char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      }
      iVar8 = local_9c;
      ImFormatString(local_78,0x40,"(%d,%d,%d,%d)",(ulong)uVar3,(ulong)uVar4,(ulong)flags_00,
                     local_9c);
      ImVec2::ImVec2(&local_88,0.0,0.0);
      bVar5 = Selectable((char *)CONCAT44(in_stack_ffffffffffffffdc,uVar3),SUB41(uVar4 >> 0x18,0),
                         flags_00,(ImVec2 *)CONCAT44(iVar8,in_stack_ffffffffffffffc8));
      if (bVar5) {
        SetClipboardText((char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      }
      ImFormatString(local_78,0x40,"#%02X%02X%02X",(ulong)uVar3,(ulong)uVar4,(ulong)flags_00,
                     local_9c);
      ImVec2::ImVec2(&local_90,0.0,0.0);
      bVar5 = Selectable((char *)CONCAT44(in_stack_ffffffffffffffdc,uVar3),SUB41(uVar4 >> 0x18,0),
                         flags_00,(ImVec2 *)CONCAT44(iVar8,in_stack_ffffffffffffffc8));
      if (bVar5) {
        SetClipboardText((char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      }
      if ((in_ESI & 2) == 0) {
        ImFormatString(local_78,0x40,"#%02X%02X%02X%02X",(ulong)uVar3,(ulong)uVar4,(ulong)flags_00,
                       iVar8);
        selected = (undefined1)(uVar4 >> 0x18);
        ImVec2::ImVec2(&local_98,0.0,0.0);
        bVar5 = Selectable((char *)CONCAT44(in_stack_ffffffffffffffdc,uVar3),(bool)selected,flags_00
                           ,(ImVec2 *)CONCAT44(iVar8,in_stack_ffffffffffffffc8));
        if (bVar5) {
          SetClipboardText((char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        }
      }
      EndPopup();
    }
    pIVar9->ColorEditOptions = uVar2;
    EndPopup();
  }
  return;
}

Assistant:

void ImGui::ColorEditOptionsPopup(const float* col, ImGuiColorEditFlags flags)
{
    bool allow_opt_inputs = !(flags & ImGuiColorEditFlags__DisplayMask);
    bool allow_opt_datatype = !(flags & ImGuiColorEditFlags__DataTypeMask);
    if ((!allow_opt_inputs && !allow_opt_datatype) || !BeginPopup("context"))
        return;
    ImGuiContext& g = *GImGui;
    ImGuiColorEditFlags opts = g.ColorEditOptions;
    if (allow_opt_inputs)
    {
        if (RadioButton("RGB", (opts & ImGuiColorEditFlags_DisplayRGB) != 0)) opts = (opts & ~ImGuiColorEditFlags__DisplayMask) | ImGuiColorEditFlags_DisplayRGB;
        if (RadioButton("HSV", (opts & ImGuiColorEditFlags_DisplayHSV) != 0)) opts = (opts & ~ImGuiColorEditFlags__DisplayMask) | ImGuiColorEditFlags_DisplayHSV;
        if (RadioButton("Hex", (opts & ImGuiColorEditFlags_DisplayHex) != 0)) opts = (opts & ~ImGuiColorEditFlags__DisplayMask) | ImGuiColorEditFlags_DisplayHex;
    }
    if (allow_opt_datatype)
    {
        if (allow_opt_inputs) Separator();
        if (RadioButton("0..255",     (opts & ImGuiColorEditFlags_Uint8) != 0)) opts = (opts & ~ImGuiColorEditFlags__DataTypeMask) | ImGuiColorEditFlags_Uint8;
        if (RadioButton("0.00..1.00", (opts & ImGuiColorEditFlags_Float) != 0)) opts = (opts & ~ImGuiColorEditFlags__DataTypeMask) | ImGuiColorEditFlags_Float;
    }

    if (allow_opt_inputs || allow_opt_datatype)
        Separator();
    if (Button("Copy as..", ImVec2(-1,0)))
        OpenPopup("Copy");
    if (BeginPopup("Copy"))
    {
        int cr = IM_F32_TO_INT8_SAT(col[0]), cg = IM_F32_TO_INT8_SAT(col[1]), cb = IM_F32_TO_INT8_SAT(col[2]), ca = (flags & ImGuiColorEditFlags_NoAlpha) ? 255 : IM_F32_TO_INT8_SAT(col[3]);
        char buf[64];
        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%.3ff, %.3ff, %.3ff, %.3ff)", col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if (Selectable(buf))
            SetClipboardText(buf);
        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%d,%d,%d,%d)", cr, cg, cb, ca);
        if (Selectable(buf))
            SetClipboardText(buf);
        ImFormatString(buf, IM_ARRAYSIZE(buf), "#%02X%02X%02X", cr, cg, cb);
        if (Selectable(buf))
            SetClipboardText(buf);
        if (!(flags & ImGuiColorEditFlags_NoAlpha))
        {
            ImFormatString(buf, IM_ARRAYSIZE(buf), "#%02X%02X%02X%02X", cr, cg, cb, ca);
            if (Selectable(buf))
                SetClipboardText(buf);
        }
        EndPopup();
    }

    g.ColorEditOptions = opts;
    EndPopup();
}